

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O2

int nghttp2_bufs_wrap_init(nghttp2_bufs *bufs,uint8_t *begin,size_t len,nghttp2_mem *mem)

{
  int iVar1;
  nghttp2_buf_chain *pnVar2;
  
  pnVar2 = (nghttp2_buf_chain *)nghttp2_mem_malloc(mem,0x30);
  if (pnVar2 == (nghttp2_buf_chain *)0x0) {
    iVar1 = -0x385;
  }
  else {
    pnVar2->next = (nghttp2_buf_chain *)0x0;
    (pnVar2->buf).end = begin;
    (pnVar2->buf).mark = begin;
    (pnVar2->buf).last = begin;
    (pnVar2->buf).pos = begin;
    (pnVar2->buf).begin = begin;
    if (len != 0) {
      (pnVar2->buf).end = begin + len;
    }
    bufs->mem = mem;
    bufs->offset = 0;
    bufs->head = pnVar2;
    bufs->cur = pnVar2;
    bufs->chunk_length = len;
    bufs->chunk_used = 1;
    bufs->max_chunk = 1;
    bufs->chunk_keep = 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int nghttp2_bufs_wrap_init(nghttp2_bufs *bufs, uint8_t *begin, size_t len,
                           nghttp2_mem *mem) {
  nghttp2_buf_chain *chain;

  chain = nghttp2_mem_malloc(mem, sizeof(nghttp2_buf_chain));
  if (chain == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  chain->next = NULL;

  nghttp2_buf_wrap_init(&chain->buf, begin, len);

  bufs->mem = mem;
  bufs->offset = 0;

  bufs->head = chain;
  bufs->cur = bufs->head;

  bufs->chunk_length = len;
  bufs->chunk_used = 1;
  bufs->max_chunk = 1;
  bufs->chunk_keep = 1;

  return 0;
}